

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

void __thiscall
despot::Tag::Observe
          (Tag *this,Belief *belief,ACT_TYPE action,
          map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          *obss)

{
  pointer pSVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppSVar6;
  const_reference this_00;
  double *pdVar7;
  mapped_type *pmVar8;
  double p;
  OBS_TYPE obs;
  State *next;
  const_reference pvStack_48;
  int i_1;
  vector<despot::State,_std::allocator<despot::State>_> *distribution;
  TagState *state;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvStack_30;
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *obss_local;
  Belief *pBStack_18;
  ACT_TYPE action_local;
  Belief *belief_local;
  Tag *this_local;
  
  particles = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)obss;
  obss_local._4_4_ = action;
  pBStack_18 = belief;
  belief_local = (Belief *)this;
  pvStack_30 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
               (**(code **)(*(long *)belief + 0x30))();
  state._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)state._4_4_;
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(pvStack_30);
    if (sVar5 <= uVar4) break;
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (pvStack_30,(long)state._4_4_);
    distribution = (vector<despot::State,_std::allocator<despot::State>_> *)*ppSVar6;
    iVar3 = (**(code **)(*(long *)&this->super_BaseTag + 0x58))(this,distribution);
    this_00 = std::
              vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
              ::operator[](&(this->super_BaseTag).transition_probabilities_,(long)iVar3);
    pvStack_48 = std::
                 vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                 ::operator[](this_00,(long)obss_local._4_4_);
    next._4_4_ = 0;
    while( true ) {
      uVar4 = (ulong)next._4_4_;
      sVar5 = std::vector<despot::State,_std::allocator<despot::State>_>::size(pvStack_48);
      if (sVar5 <= uVar4) break;
      obs = (OBS_TYPE)
            std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                      (pvStack_48,(long)next._4_4_);
      pdVar7 = (double *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->obs_,(long)*(int *)(obs + 0xc));
      p = *pdVar7;
      pSVar1 = distribution[1].super__Vector_base<despot::State,_std::allocator<despot::State>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar2 = *(double *)(obs + 0x18);
      pmVar8 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[]((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                             *)particles,(key_type_conflict *)&p);
      *pmVar8 = (double)pSVar1 * dVar2 + *pmVar8;
      next._4_4_ = next._4_4_ + 1;
    }
    state._4_4_ = state._4_4_ + 1;
  }
  return;
}

Assistant:

void Tag::Observe(const Belief* belief, ACT_TYPE action,
	map<OBS_TYPE, double>& obss) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();
	for (int i = 0; i < particles.size(); i++) {
		TagState* state = static_cast<TagState*>(particles[i]);
		const vector<State>& distribution = transition_probabilities_[GetIndex(
			state)][action];
		for (int i = 0; i < distribution.size(); i++) {
			const State& next = distribution[i];
			OBS_TYPE obs = obs_[next.state_id];
			double p = state->weight * next.weight;
			obss[obs] += p;
		}
	}
}